

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

long __thiscall camp::Enum::value(Enum *this,string *name)

{
  iterator iVar1;
  EnumNameNotFound *__return_storage_ptr__;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  EnumNameNotFound local_68;
  
  iVar1 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::Enum::Pair,std::__cxx11::string,&camp::Enum::Pair::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<3,camp::Enum::Pair,boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::Enum::Pair,long,&camp::Enum::Pair::value>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::Enum::Pair,std::__cxx11::string,&camp::Enum::Pair::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::Enum::Pair>>,boost::mpl::v_item<camp::Enum::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::find<std::__cxx11::string>
                    ((ordered_index_impl<boost::multi_index::member<camp::Enum::Pair,std::__cxx11::string,&camp::Enum::Pair::name>,std::less<std::__cxx11::string>,boost::multi_index::detail::nth_layer<3,camp::Enum::Pair,boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::Enum::Pair,long,&camp::Enum::Pair::value>,mpl_::na>,boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<camp::Enum::Pair,std::__cxx11::string,&camp::Enum::Pair::name>,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<camp::Enum::Pair>>,boost::mpl::v_item<camp::Enum::Name,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)&(this->m_pairs).super_type,name);
  if ((random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>
       *)iVar1.node !=
      (this->m_pairs).
      super_header_holder<boost::multi_index::detail::random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>_*,_boost::multi_index::multi_index_container<camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>_>
      .member) {
    return *(long *)((long)&((iVar1.node)->
                            super_index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>
                            ).super_pod_value_holder<camp::Enum::Pair>.space.data_ + 0x20);
  }
  __return_storage_ptr__ = (EnumNameNotFound *)__cxa_allocate_exception(0x48);
  EnumNameNotFound::EnumNameNotFound(&local_68,name,&this->m_name);
  std::__cxx11::string::string
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enum.cpp"
             ,&local_a9);
  std::__cxx11::string::string
            ((string *)&local_a8,"long camp::Enum::value(const std::string &) const",&local_aa);
  Error::prepare<camp::EnumNameNotFound>(__return_storage_ptr__,&local_68,&local_88,0x60,&local_a8);
  __cxa_throw(__return_storage_ptr__,&EnumNameNotFound::typeinfo,Error::~Error);
}

Assistant:

long Enum::value(const std::string& name) const
{
    const NameIndex& names = m_pairs.get<Name>();

    NameIndex::const_iterator it = names.find(name);
    if (it == names.end())
        CAMP_ERROR(EnumNameNotFound(name, m_name));

    return it->value;
}